

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CordInputStream::Next(CordInputStream *this,void **data,int *size)

{
  size_t sVar1;
  bool bVar2;
  
  if ((this->available_ == 0) && (bVar2 = NextChunk(this,0), !bVar2)) {
    return false;
  }
  sVar1 = this->available_;
  *data = this->data_ + (this->size_ - sVar1);
  *size = (int)sVar1;
  this->bytes_remaining_ = this->bytes_remaining_ - sVar1;
  this->available_ = 0;
  return true;
}

Assistant:

bool CordInputStream::Next(const void** data, int* size) {
  if (available_ > 0 || NextChunk(0)) {
    *data = data_ + size_ - available_;
    *size = available_;
    bytes_remaining_ -= available_;
    available_ = 0;
    return true;
  }
  return false;
}